

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * amrex::complementIn(BoxArray *__return_storage_ptr__,Box *b,BoxArray *ba)

{
  BoxList local_30;
  
  BoxArray::complementIn(&local_30,ba,b);
  BoxArray::BoxArray(__return_storage_ptr__,&local_30);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

BoxArray
complementIn (const Box&      b,
              const BoxArray& ba)
{
    return BoxArray { ba.complementIn(b) };
}